

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

PortSymbol * __thiscall
slang::BumpAllocator::emplace<slang::ast::PortSymbol,char_const(&)[1],slang::SourceLocation,bool>
          (BumpAllocator *this,char (*args) [1],SourceLocation *args_1,bool *args_2)

{
  PortSymbol *this_00;
  size_t sVar1;
  string_view name;
  
  this_00 = (PortSymbol *)allocate(this,0x80,8);
  sVar1 = strlen(*args);
  name._M_str = *args;
  name._M_len = sVar1;
  ast::PortSymbol::PortSymbol(this_00,name,*args_1,*args_2);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }